

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  byte bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  char cVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong *puVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [32];
  float fVar39;
  float fVar48;
  float fVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar42 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar47 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar61 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [16];
  undefined1 auVar64 [64];
  undefined1 auVar67 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  float fVar73;
  vfloat4 a0;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  float fVar96;
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  float fVar100;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar103;
  undefined1 auVar104 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 in_ZMM14 [64];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  NodeRef stack [564];
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      aVar8 = (ray->dir).field_0.field_1;
      auVar54 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
      auVar55 = vrsqrtss_avx(auVar54,auVar54);
      fVar73 = auVar55._0_4_;
      local_1218[0] = fVar73 * 1.5 - auVar54._0_4_ * 0.5 * fVar73 * fVar73 * fVar73;
      fVar73 = (ray->dir).field_0.m128[0];
      fVar4 = (ray->dir).field_0.m128[1];
      fVar5 = (ray->dir).field_0.m128[2];
      auVar40 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
      auVar65._0_4_ = aVar8.x * auVar40._0_4_;
      auVar65._4_4_ = aVar8.y * auVar40._4_4_;
      auVar65._8_4_ = aVar8.z * auVar40._8_4_;
      auVar65._12_4_ = aVar8.field_3.w * auVar40._12_4_;
      auVar55 = vshufpd_avx(auVar65,auVar65,1);
      auVar54 = vmovshdup_avx(auVar65);
      auVar88._8_4_ = 0x80000000;
      auVar88._0_8_ = 0x8000000080000000;
      auVar88._12_4_ = 0x80000000;
      auVar78._12_4_ = 0;
      auVar78._0_12_ = ZEXT812(0);
      auVar78 = auVar78 << 0x20;
      auVar60 = vunpckhps_avx(auVar65,auVar78);
      auVar66 = vshufps_avx(auVar60,ZEXT416(auVar54._0_4_ ^ 0x80000000),0x41);
      auVar84._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      auVar84._8_8_ = auVar55._8_8_ ^ auVar88._8_8_;
      auVar60 = vinsertps_avx(auVar84,auVar65,0x2a);
      auVar54 = vdpps_avx(auVar66,auVar66,0x7f);
      auVar55 = vdpps_avx(auVar60,auVar60,0x7f);
      auVar54 = vcmpps_avx(auVar55,auVar54,1);
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar54 = vblendvps_avx(auVar60,auVar66,auVar54);
      auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
      auVar60 = vrsqrtss_avx(auVar55,auVar55);
      fVar82 = auVar60._0_4_;
      auVar55 = ZEXT416((uint)(fVar82 * 1.5 - auVar55._0_4_ * 0.5 * fVar82 * fVar82 * fVar82));
      auVar55 = vshufps_avx(auVar55,auVar55,0);
      auVar85._0_4_ = auVar54._0_4_ * auVar55._0_4_;
      auVar85._4_4_ = auVar54._4_4_ * auVar55._4_4_;
      auVar85._8_4_ = auVar54._8_4_ * auVar55._8_4_;
      auVar85._12_4_ = auVar54._12_4_ * auVar55._12_4_;
      auVar54 = vshufps_avx(auVar85,auVar85,0xc9);
      auVar55 = vshufps_avx(auVar65,auVar65,0xc9);
      auVar94._0_4_ = auVar55._0_4_ * auVar85._0_4_;
      auVar94._4_4_ = auVar55._4_4_ * auVar85._4_4_;
      auVar94._8_4_ = auVar55._8_4_ * auVar85._8_4_;
      auVar94._12_4_ = auVar55._12_4_ * auVar85._12_4_;
      auVar89._0_4_ = auVar54._0_4_ * auVar65._0_4_;
      auVar89._4_4_ = auVar54._4_4_ * auVar65._4_4_;
      auVar89._8_4_ = auVar54._8_4_ * auVar65._8_4_;
      auVar89._12_4_ = auVar54._12_4_ * auVar65._12_4_;
      auVar54 = vsubps_avx(auVar89,auVar94);
      auVar60 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar54 = vdpps_avx(auVar60,auVar60,0x7f);
      auVar55 = vrsqrtss_avx(auVar54,auVar54);
      fVar82 = auVar55._0_4_;
      auVar54 = ZEXT416((uint)(fVar82 * 1.5 - auVar54._0_4_ * 0.5 * fVar82 * fVar82 * fVar82));
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar55._0_4_ = auVar60._0_4_ * auVar54._0_4_;
      auVar55._4_4_ = auVar60._4_4_ * auVar54._4_4_;
      auVar55._8_4_ = auVar60._8_4_ * auVar54._8_4_;
      auVar55._12_4_ = auVar60._12_4_ * auVar54._12_4_;
      auVar54._0_4_ = auVar40._0_4_ * auVar65._0_4_;
      auVar54._4_4_ = auVar40._4_4_ * auVar65._4_4_;
      auVar54._8_4_ = auVar40._8_4_ * auVar65._8_4_;
      auVar54._12_4_ = auVar40._12_4_ * auVar65._12_4_;
      auVar60 = vunpcklps_avx(auVar85,auVar54);
      auVar54 = vunpckhps_avx(auVar85,auVar54);
      auVar40 = vunpcklps_avx(auVar55,auVar78);
      auVar55 = vunpckhps_avx(auVar55,auVar78);
      local_11e8 = vunpcklps_avx(auVar54,auVar55);
      local_1208 = vunpcklps_avx(auVar60,auVar40);
      local_11f8 = vunpckhps_avx(auVar60,auVar40);
      puVar35 = local_11d0;
      auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar60._8_4_ = 0x7fffffff;
      auVar60._0_8_ = 0x7fffffff7fffffff;
      auVar60._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx((undefined1  [16])aVar8,auVar60);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar54,auVar66,1);
      auVar54 = vblendvps_avx((undefined1  [16])aVar8,auVar66,auVar54);
      auVar60 = vrcpps_avx(auVar54);
      fVar96 = auVar60._0_4_;
      auVar40._0_4_ = auVar54._0_4_ * fVar96;
      fVar39 = auVar60._4_4_;
      auVar40._4_4_ = auVar54._4_4_ * fVar39;
      fVar103 = auVar60._8_4_;
      auVar40._8_4_ = auVar54._8_4_ * fVar103;
      fVar48 = auVar60._12_4_;
      auVar40._12_4_ = auVar54._12_4_ * fVar48;
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar54 = vsubps_avx(auVar42,auVar40);
      fVar82 = (ray->org).field_0.m128[0];
      fVar6 = (ray->org).field_0.m128[1];
      fVar7 = (ray->org).field_0.m128[2];
      auVar41._0_4_ = fVar96 + fVar96 * auVar54._0_4_;
      auVar41._4_4_ = fVar39 + fVar39 * auVar54._4_4_;
      auVar41._8_4_ = fVar103 + fVar103 * auVar54._8_4_;
      auVar41._12_4_ = fVar48 + fVar48 * auVar54._12_4_;
      auVar40 = vshufps_avx(auVar41,auVar41,0);
      auVar54 = vmovshdup_avx(auVar41);
      auVar64 = ZEXT1664(auVar54);
      auVar66 = vshufps_avx(auVar41,auVar41,0x55);
      auVar60 = vshufpd_avx(auVar41,auVar41,1);
      auVar72 = ZEXT1664(auVar60);
      auVar78 = vshufps_avx(auVar41,auVar41,0xaa);
      uVar37 = (ulong)(auVar41._0_4_ < 0.0) * 0x20;
      uVar34 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x40;
      uVar36 = (ulong)(auVar60._0_4_ < 0.0) << 5 | 0x80;
      auVar54 = vshufps_avx(auVar55,auVar55,0);
      auVar97._16_16_ = auVar54;
      auVar97._0_16_ = auVar54;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar101._16_16_ = auVar54;
      auVar101._0_16_ = auVar54;
LAB_00e4f630:
      if (puVar35 != &local_11d8) {
        uVar31 = puVar35[-1];
        puVar35 = puVar35 + -1;
        do {
          fVar3 = (ray->dir).field_0.m128[3];
          auVar38._4_4_ = fVar3;
          auVar38._0_4_ = fVar3;
          auVar38._8_4_ = fVar3;
          auVar38._12_4_ = fVar3;
          auVar38._16_4_ = fVar3;
          auVar38._20_4_ = fVar3;
          auVar38._24_4_ = fVar3;
          auVar38._28_4_ = fVar3;
          fVar96 = 1.0 - fVar3;
          auVar55 = vshufps_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),0);
          auVar59 = ZEXT3264(CONCAT1616(auVar55,auVar55));
          auVar60 = vshufps_avx(ZEXT416((uint)(fVar96 * 0.0)),ZEXT416((uint)(fVar96 * 0.0)),0);
          auVar47 = ZEXT3264(CONCAT1616(auVar60,auVar60));
          do {
            if ((uVar31 & 8) != 0) {
              auVar64 = ZEXT1664(auVar64._0_16_);
              auVar72 = ZEXT1664(auVar72._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              cVar29 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar31 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_1218,ray,context);
              if (cVar29 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_00e4f630;
            }
            uVar32 = (uint)uVar31 & 7;
            uVar30 = uVar31 & 0xfffffffffffffff0;
            fVar96 = auVar47._28_4_;
            if (uVar32 == 3) {
              fVar39 = in_ZMM15._28_4_;
              auVar45._0_4_ =
                   fVar73 * *(float *)(uVar30 + 0x40) +
                   *(float *)(uVar30 + 0xa0) * fVar4 + *(float *)(uVar30 + 0x100) * fVar5;
              auVar45._4_4_ =
                   fVar73 * *(float *)(uVar30 + 0x44) +
                   *(float *)(uVar30 + 0xa4) * fVar4 + *(float *)(uVar30 + 0x104) * fVar5;
              auVar45._8_4_ =
                   fVar73 * *(float *)(uVar30 + 0x48) +
                   *(float *)(uVar30 + 0xa8) * fVar4 + *(float *)(uVar30 + 0x108) * fVar5;
              auVar45._12_4_ =
                   fVar73 * *(float *)(uVar30 + 0x4c) +
                   *(float *)(uVar30 + 0xac) * fVar4 + *(float *)(uVar30 + 0x10c) * fVar5;
              auVar45._16_4_ =
                   fVar73 * *(float *)(uVar30 + 0x50) +
                   *(float *)(uVar30 + 0xb0) * fVar4 + *(float *)(uVar30 + 0x110) * fVar5;
              auVar45._20_4_ =
                   fVar73 * *(float *)(uVar30 + 0x54) +
                   *(float *)(uVar30 + 0xb4) * fVar4 + *(float *)(uVar30 + 0x114) * fVar5;
              auVar45._24_4_ =
                   fVar73 * *(float *)(uVar30 + 0x58) +
                   *(float *)(uVar30 + 0xb8) * fVar4 + *(float *)(uVar30 + 0x118) * fVar5;
              auVar45._28_4_ = fVar39 + fVar5 + fVar96;
              auVar57._0_4_ =
                   fVar73 * *(float *)(uVar30 + 0x60) +
                   *(float *)(uVar30 + 0x120) * fVar5 + *(float *)(uVar30 + 0xc0) * fVar4;
              auVar57._4_4_ =
                   fVar73 * *(float *)(uVar30 + 100) +
                   *(float *)(uVar30 + 0x124) * fVar5 + *(float *)(uVar30 + 0xc4) * fVar4;
              auVar57._8_4_ =
                   fVar73 * *(float *)(uVar30 + 0x68) +
                   *(float *)(uVar30 + 0x128) * fVar5 + *(float *)(uVar30 + 200) * fVar4;
              auVar57._12_4_ =
                   fVar73 * *(float *)(uVar30 + 0x6c) +
                   *(float *)(uVar30 + 300) * fVar5 + *(float *)(uVar30 + 0xcc) * fVar4;
              auVar57._16_4_ =
                   fVar73 * *(float *)(uVar30 + 0x70) +
                   *(float *)(uVar30 + 0x130) * fVar5 + *(float *)(uVar30 + 0xd0) * fVar4;
              auVar57._20_4_ =
                   fVar73 * *(float *)(uVar30 + 0x74) +
                   *(float *)(uVar30 + 0x134) * fVar5 + *(float *)(uVar30 + 0xd4) * fVar4;
              auVar57._24_4_ =
                   fVar73 * *(float *)(uVar30 + 0x78) +
                   *(float *)(uVar30 + 0x138) * fVar5 + *(float *)(uVar30 + 0xd8) * fVar4;
              auVar57._28_4_ = fVar39 + in_ZMM14._28_4_ + fVar5;
              auVar104._0_4_ =
                   fVar73 * *(float *)(uVar30 + 0x80) +
                   *(float *)(uVar30 + 0xe0) * fVar4 + fVar5 * *(float *)(uVar30 + 0x140);
              auVar104._4_4_ =
                   fVar73 * *(float *)(uVar30 + 0x84) +
                   *(float *)(uVar30 + 0xe4) * fVar4 + fVar5 * *(float *)(uVar30 + 0x144);
              auVar104._8_4_ =
                   fVar73 * *(float *)(uVar30 + 0x88) +
                   *(float *)(uVar30 + 0xe8) * fVar4 + fVar5 * *(float *)(uVar30 + 0x148);
              auVar104._12_4_ =
                   fVar73 * *(float *)(uVar30 + 0x8c) +
                   *(float *)(uVar30 + 0xec) * fVar4 + fVar5 * *(float *)(uVar30 + 0x14c);
              auVar104._16_4_ =
                   fVar73 * *(float *)(uVar30 + 0x90) +
                   *(float *)(uVar30 + 0xf0) * fVar4 + fVar5 * *(float *)(uVar30 + 0x150);
              auVar104._20_4_ =
                   fVar73 * *(float *)(uVar30 + 0x94) +
                   *(float *)(uVar30 + 0xf4) * fVar4 + fVar5 * *(float *)(uVar30 + 0x154);
              auVar104._24_4_ =
                   fVar73 * *(float *)(uVar30 + 0x98) +
                   *(float *)(uVar30 + 0xf8) * fVar4 + fVar5 * *(float *)(uVar30 + 0x158);
              auVar104._28_4_ = fVar39 + in_ZMM14._28_4_ + fVar39;
              auVar69._8_4_ = 0x7fffffff;
              auVar69._0_8_ = 0x7fffffff7fffffff;
              auVar69._12_4_ = 0x7fffffff;
              auVar69._16_4_ = 0x7fffffff;
              auVar69._20_4_ = 0x7fffffff;
              auVar69._24_4_ = 0x7fffffff;
              auVar69._28_4_ = 0x7fffffff;
              auVar81 = vandps_avx(auVar45,auVar69);
              auVar76._8_4_ = 0x219392ef;
              auVar76._0_8_ = 0x219392ef219392ef;
              auVar76._12_4_ = 0x219392ef;
              auVar76._16_4_ = 0x219392ef;
              auVar76._20_4_ = 0x219392ef;
              auVar76._24_4_ = 0x219392ef;
              auVar76._28_4_ = 0x219392ef;
              auVar81 = vcmpps_avx(auVar81,auVar76,1);
              auVar12 = vblendvps_avx(auVar45,auVar76,auVar81);
              auVar81 = vandps_avx(auVar57,auVar69);
              auVar81 = vcmpps_avx(auVar81,auVar76,1);
              auVar10 = vblendvps_avx(auVar57,auVar76,auVar81);
              auVar81 = vandps_avx(auVar104,auVar69);
              auVar81 = vcmpps_avx(auVar81,auVar76,1);
              auVar11 = vrcpps_avx(auVar12);
              auVar81 = vblendvps_avx(auVar104,auVar76,auVar81);
              fVar39 = auVar11._0_4_;
              fVar48 = auVar11._4_4_;
              auVar13._4_4_ = auVar12._4_4_ * fVar48;
              auVar13._0_4_ = auVar12._0_4_ * fVar39;
              fVar49 = auVar11._8_4_;
              auVar13._8_4_ = auVar12._8_4_ * fVar49;
              fVar50 = auVar11._12_4_;
              auVar13._12_4_ = auVar12._12_4_ * fVar50;
              fVar51 = auVar11._16_4_;
              auVar13._16_4_ = auVar12._16_4_ * fVar51;
              fVar52 = auVar11._20_4_;
              auVar13._20_4_ = auVar12._20_4_ * fVar52;
              fVar53 = auVar11._24_4_;
              auVar13._24_4_ = auVar12._24_4_ * fVar53;
              auVar13._28_4_ = auVar12._28_4_;
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = 0x3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              auVar80._16_4_ = 0x3f800000;
              auVar80._20_4_ = 0x3f800000;
              auVar80._24_4_ = 0x3f800000;
              auVar80._28_4_ = 0x3f800000;
              auVar13 = vsubps_avx(auVar80,auVar13);
              auVar12 = vrcpps_avx(auVar10);
              fVar39 = fVar39 + fVar39 * auVar13._0_4_;
              fVar48 = fVar48 + fVar48 * auVar13._4_4_;
              fVar49 = fVar49 + fVar49 * auVar13._8_4_;
              fVar50 = fVar50 + fVar50 * auVar13._12_4_;
              fVar51 = fVar51 + fVar51 * auVar13._16_4_;
              fVar52 = fVar52 + fVar52 * auVar13._20_4_;
              fVar53 = fVar53 + fVar53 * auVar13._24_4_;
              fVar111 = auVar12._0_4_;
              fVar112 = auVar12._4_4_;
              auVar21._4_4_ = fVar112 * auVar10._4_4_;
              auVar21._0_4_ = fVar111 * auVar10._0_4_;
              fVar113 = auVar12._8_4_;
              auVar21._8_4_ = fVar113 * auVar10._8_4_;
              fVar114 = auVar12._12_4_;
              auVar21._12_4_ = fVar114 * auVar10._12_4_;
              fVar115 = auVar12._16_4_;
              auVar21._16_4_ = fVar115 * auVar10._16_4_;
              fVar116 = auVar12._20_4_;
              auVar21._20_4_ = fVar116 * auVar10._20_4_;
              fVar117 = auVar12._24_4_;
              auVar21._24_4_ = fVar117 * auVar10._24_4_;
              auVar21._28_4_ = auVar11._28_4_ + auVar13._28_4_;
              auVar12 = vsubps_avx(auVar80,auVar21);
              fVar111 = fVar111 + fVar111 * auVar12._0_4_;
              fVar112 = fVar112 + fVar112 * auVar12._4_4_;
              fVar113 = fVar113 + fVar113 * auVar12._8_4_;
              fVar114 = fVar114 + fVar114 * auVar12._12_4_;
              fVar115 = fVar115 + fVar115 * auVar12._16_4_;
              fVar116 = fVar116 + fVar116 * auVar12._20_4_;
              fVar117 = fVar117 + fVar117 * auVar12._24_4_;
              auVar12 = vrcpps_avx(auVar81);
              fVar103 = auVar12._0_4_;
              fVar105 = auVar12._4_4_;
              auVar10._4_4_ = auVar81._4_4_ * fVar105;
              auVar10._0_4_ = auVar81._0_4_ * fVar103;
              fVar106 = auVar12._8_4_;
              auVar10._8_4_ = auVar81._8_4_ * fVar106;
              fVar107 = auVar12._12_4_;
              auVar10._12_4_ = auVar81._12_4_ * fVar107;
              fVar108 = auVar12._16_4_;
              auVar10._16_4_ = auVar81._16_4_ * fVar108;
              fVar109 = auVar12._20_4_;
              auVar10._20_4_ = auVar81._20_4_ * fVar109;
              fVar110 = auVar12._24_4_;
              auVar10._24_4_ = auVar81._24_4_ * fVar110;
              auVar10._28_4_ = auVar13._28_4_;
              auVar81 = vsubps_avx(auVar80,auVar10);
              fVar103 = fVar103 + fVar103 * auVar81._0_4_;
              fVar105 = fVar105 + fVar105 * auVar81._4_4_;
              fVar106 = fVar106 + fVar106 * auVar81._8_4_;
              fVar107 = fVar107 + fVar107 * auVar81._12_4_;
              fVar108 = fVar108 + fVar108 * auVar81._16_4_;
              fVar109 = fVar109 + fVar109 * auVar81._20_4_;
              fVar110 = fVar110 + fVar110 * auVar81._24_4_;
              local_1238 = auVar60._0_4_;
              fStack_1234 = auVar60._4_4_;
              fStack_1230 = auVar60._8_4_;
              fStack_122c = auVar60._12_4_;
              auVar81._0_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x1c0);
              auVar81._4_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 0x1c4);
              auVar81._8_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x1c8);
              auVar81._12_4_ = fStack_122c + fVar3 * *(float *)(uVar30 + 0x1cc);
              auVar81._16_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x1d0);
              auVar81._20_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 0x1d4);
              auVar81._24_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x1d8);
              auVar81._28_4_ = fStack_122c + fVar96;
              fVar100 = *(float *)(uVar30 + 0x11c) + *(float *)(uVar30 + 0x17c);
              fVar93 = *(float *)(uVar30 + 0xbc) + fVar100;
              auVar70._0_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x1e0);
              auVar70._4_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 0x1e4);
              auVar70._8_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x1e8);
              auVar70._12_4_ = fStack_122c + fVar3 * *(float *)(uVar30 + 0x1ec);
              auVar70._16_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x1f0);
              auVar70._20_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 500);
              auVar70._24_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x1f8);
              auVar70._28_4_ = fStack_122c + fVar96;
              fVar96 = *(float *)(uVar30 + 0x13c) + *(float *)(uVar30 + 0x19c);
              auVar77._0_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x200);
              auVar77._4_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 0x204);
              auVar77._8_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x208);
              auVar77._12_4_ = fStack_122c + fVar3 * *(float *)(uVar30 + 0x20c);
              auVar77._16_4_ = local_1238 + fVar3 * *(float *)(uVar30 + 0x210);
              auVar77._20_4_ = fStack_1234 + fVar3 * *(float *)(uVar30 + 0x214);
              auVar77._24_4_ = fStack_1230 + fVar3 * *(float *)(uVar30 + 0x218);
              auVar77._28_4_ = fStack_122c + 1e-18;
              local_1458 = auVar55._0_4_;
              fStack_1454 = auVar55._4_4_;
              fStack_1450 = auVar55._8_4_;
              fStack_144c = auVar55._12_4_;
              auVar102._0_4_ = fVar3 * *(float *)(uVar30 + 0x220) + local_1458;
              auVar102._4_4_ = fVar3 * *(float *)(uVar30 + 0x224) + fStack_1454;
              auVar102._8_4_ = fVar3 * *(float *)(uVar30 + 0x228) + fStack_1450;
              auVar102._12_4_ = fVar3 * *(float *)(uVar30 + 0x22c) + fStack_144c;
              auVar102._16_4_ = fVar3 * *(float *)(uVar30 + 0x230) + local_1458;
              auVar102._20_4_ = fVar3 * *(float *)(uVar30 + 0x234) + fStack_1454;
              auVar102._24_4_ = fVar3 * *(float *)(uVar30 + 0x238) + fStack_1450;
              auVar102._28_4_ = auVar54._12_4_ + fStack_144c;
              auVar98._0_4_ = fVar3 * *(float *)(uVar30 + 0x240) + local_1458;
              auVar98._4_4_ = fVar3 * *(float *)(uVar30 + 0x244) + fStack_1454;
              auVar98._8_4_ = fVar3 * *(float *)(uVar30 + 0x248) + fStack_1450;
              auVar98._12_4_ = fVar3 * *(float *)(uVar30 + 0x24c) + fStack_144c;
              auVar98._16_4_ = fVar3 * *(float *)(uVar30 + 0x250) + local_1458;
              auVar98._20_4_ = fVar3 * *(float *)(uVar30 + 0x254) + fStack_1454;
              auVar98._24_4_ = fVar3 * *(float *)(uVar30 + 600) + fStack_1450;
              auVar98._28_4_ = fVar100 + fStack_144c;
              auVar95._0_4_ = fVar3 * *(float *)(uVar30 + 0x260) + local_1458;
              auVar95._4_4_ = fVar3 * *(float *)(uVar30 + 0x264) + fStack_1454;
              auVar95._8_4_ = fVar3 * *(float *)(uVar30 + 0x268) + fStack_1450;
              auVar95._12_4_ = fVar3 * *(float *)(uVar30 + 0x26c) + fStack_144c;
              auVar95._16_4_ = fVar3 * *(float *)(uVar30 + 0x270) + local_1458;
              auVar95._20_4_ = fVar3 * *(float *)(uVar30 + 0x274) + fStack_1454;
              auVar95._24_4_ = fVar3 * *(float *)(uVar30 + 0x278) + fStack_1450;
              auVar95._28_4_ = fVar96 + fStack_144c;
              auVar83._0_4_ =
                   *(float *)(uVar30 + 0xa0) * fVar6 +
                   *(float *)(uVar30 + 0x100) * fVar7 + *(float *)(uVar30 + 0x160) +
                   fVar82 * *(float *)(uVar30 + 0x40);
              auVar83._4_4_ =
                   *(float *)(uVar30 + 0xa4) * fVar6 +
                   *(float *)(uVar30 + 0x104) * fVar7 + *(float *)(uVar30 + 0x164) +
                   fVar82 * *(float *)(uVar30 + 0x44);
              auVar83._8_4_ =
                   *(float *)(uVar30 + 0xa8) * fVar6 +
                   *(float *)(uVar30 + 0x108) * fVar7 + *(float *)(uVar30 + 0x168) +
                   fVar82 * *(float *)(uVar30 + 0x48);
              auVar83._12_4_ =
                   *(float *)(uVar30 + 0xac) * fVar6 +
                   *(float *)(uVar30 + 0x10c) * fVar7 + *(float *)(uVar30 + 0x16c) +
                   fVar82 * *(float *)(uVar30 + 0x4c);
              auVar83._16_4_ =
                   *(float *)(uVar30 + 0xb0) * fVar6 +
                   *(float *)(uVar30 + 0x110) * fVar7 + *(float *)(uVar30 + 0x170) +
                   fVar82 * *(float *)(uVar30 + 0x50);
              auVar83._20_4_ =
                   *(float *)(uVar30 + 0xb4) * fVar6 +
                   *(float *)(uVar30 + 0x114) * fVar7 + *(float *)(uVar30 + 0x174) +
                   fVar82 * *(float *)(uVar30 + 0x54);
              auVar83._24_4_ =
                   *(float *)(uVar30 + 0xb8) * fVar6 +
                   *(float *)(uVar30 + 0x118) * fVar7 + *(float *)(uVar30 + 0x178) +
                   fVar82 * *(float *)(uVar30 + 0x58);
              auVar83._28_4_ = fVar93 + *(float *)(uVar30 + 0x15c);
              auVar87._0_4_ =
                   fVar82 * *(float *)(uVar30 + 0x60) +
                   *(float *)(uVar30 + 0xc0) * fVar6 +
                   *(float *)(uVar30 + 0x120) * fVar7 + *(float *)(uVar30 + 0x180);
              auVar87._4_4_ =
                   fVar82 * *(float *)(uVar30 + 100) +
                   *(float *)(uVar30 + 0xc4) * fVar6 +
                   *(float *)(uVar30 + 0x124) * fVar7 + *(float *)(uVar30 + 0x184);
              auVar87._8_4_ =
                   fVar82 * *(float *)(uVar30 + 0x68) +
                   *(float *)(uVar30 + 200) * fVar6 +
                   *(float *)(uVar30 + 0x128) * fVar7 + *(float *)(uVar30 + 0x188);
              auVar87._12_4_ =
                   fVar82 * *(float *)(uVar30 + 0x6c) +
                   *(float *)(uVar30 + 0xcc) * fVar6 +
                   *(float *)(uVar30 + 300) * fVar7 + *(float *)(uVar30 + 0x18c);
              auVar87._16_4_ =
                   fVar82 * *(float *)(uVar30 + 0x70) +
                   *(float *)(uVar30 + 0xd0) * fVar6 +
                   *(float *)(uVar30 + 0x130) * fVar7 + *(float *)(uVar30 + 400);
              auVar87._20_4_ =
                   fVar82 * *(float *)(uVar30 + 0x74) +
                   *(float *)(uVar30 + 0xd4) * fVar6 +
                   *(float *)(uVar30 + 0x134) * fVar7 + *(float *)(uVar30 + 0x194);
              auVar87._24_4_ =
                   fVar82 * *(float *)(uVar30 + 0x78) +
                   *(float *)(uVar30 + 0xd8) * fVar6 +
                   *(float *)(uVar30 + 0x138) * fVar7 + *(float *)(uVar30 + 0x198);
              auVar87._28_4_ = fVar93 + *(float *)(uVar30 + 0xdc) + fVar96;
              auVar90._0_4_ =
                   fVar82 * *(float *)(uVar30 + 0x80) +
                   *(float *)(uVar30 + 0xe0) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x140) + *(float *)(uVar30 + 0x1a0);
              auVar90._4_4_ =
                   fVar82 * *(float *)(uVar30 + 0x84) +
                   *(float *)(uVar30 + 0xe4) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x144) + *(float *)(uVar30 + 0x1a4);
              auVar90._8_4_ =
                   fVar82 * *(float *)(uVar30 + 0x88) +
                   *(float *)(uVar30 + 0xe8) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x148) + *(float *)(uVar30 + 0x1a8);
              auVar90._12_4_ =
                   fVar82 * *(float *)(uVar30 + 0x8c) +
                   *(float *)(uVar30 + 0xec) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x14c) + *(float *)(uVar30 + 0x1ac);
              auVar90._16_4_ =
                   fVar82 * *(float *)(uVar30 + 0x90) +
                   *(float *)(uVar30 + 0xf0) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x150) + *(float *)(uVar30 + 0x1b0);
              auVar90._20_4_ =
                   fVar82 * *(float *)(uVar30 + 0x94) +
                   *(float *)(uVar30 + 0xf4) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x154) + *(float *)(uVar30 + 0x1b4);
              auVar90._24_4_ =
                   fVar82 * *(float *)(uVar30 + 0x98) +
                   *(float *)(uVar30 + 0xf8) * fVar6 +
                   fVar7 * *(float *)(uVar30 + 0x158) + *(float *)(uVar30 + 0x1b8);
              auVar90._28_4_ =
                   fVar93 + *(float *)(uVar30 + 0x15c) + fStack_144c + *(float *)(uVar30 + 0x1bc);
              auVar81 = vsubps_avx(auVar81,auVar83);
              auVar12 = vsubps_avx(auVar70,auVar87);
              auVar10 = vsubps_avx(auVar77,auVar90);
              auVar74._0_4_ = auVar81._0_4_ * fVar39;
              auVar74._4_4_ = auVar81._4_4_ * fVar48;
              auVar74._8_4_ = auVar81._8_4_ * fVar49;
              auVar74._12_4_ = auVar81._12_4_ * fVar50;
              auVar11._16_4_ = auVar81._16_4_ * fVar51;
              auVar11._0_16_ = auVar74;
              auVar11._20_4_ = auVar81._20_4_ * fVar52;
              auVar11._24_4_ = auVar81._24_4_ * fVar53;
              auVar11._28_4_ = auVar77._28_4_;
              auVar67._0_4_ = fVar111 * auVar12._0_4_;
              auVar67._4_4_ = fVar112 * auVar12._4_4_;
              auVar67._8_4_ = fVar113 * auVar12._8_4_;
              auVar67._12_4_ = fVar114 * auVar12._12_4_;
              auVar22._16_4_ = fVar115 * auVar12._16_4_;
              auVar22._0_16_ = auVar67;
              auVar22._20_4_ = fVar116 * auVar12._20_4_;
              auVar22._24_4_ = fVar117 * auVar12._24_4_;
              auVar22._28_4_ = auVar12._28_4_;
              auVar61._0_4_ = fVar103 * auVar10._0_4_;
              auVar61._4_4_ = fVar105 * auVar10._4_4_;
              auVar61._8_4_ = fVar106 * auVar10._8_4_;
              auVar61._12_4_ = fVar107 * auVar10._12_4_;
              auVar23._16_4_ = fVar108 * auVar10._16_4_;
              auVar23._0_16_ = auVar61;
              auVar23._20_4_ = fVar109 * auVar10._20_4_;
              auVar23._24_4_ = fVar110 * auVar10._24_4_;
              auVar23._28_4_ = auVar81._28_4_;
              auVar81 = vsubps_avx(auVar102,auVar83);
              auVar12 = vsubps_avx(auVar98,auVar87);
              auVar10 = vsubps_avx(auVar95,auVar90);
              auVar86._0_4_ = auVar81._0_4_ * fVar39;
              auVar86._4_4_ = auVar81._4_4_ * fVar48;
              auVar86._8_4_ = auVar81._8_4_ * fVar49;
              auVar86._12_4_ = auVar81._12_4_ * fVar50;
              auVar24._16_4_ = auVar81._16_4_ * fVar51;
              auVar24._0_16_ = auVar86;
              auVar24._20_4_ = auVar81._20_4_ * fVar52;
              auVar24._24_4_ = auVar81._24_4_ * fVar53;
              auVar24._28_4_ = auVar87._28_4_;
              auVar79._0_4_ = fVar111 * auVar12._0_4_;
              auVar79._4_4_ = fVar112 * auVar12._4_4_;
              auVar79._8_4_ = fVar113 * auVar12._8_4_;
              auVar79._12_4_ = fVar114 * auVar12._12_4_;
              auVar25._16_4_ = fVar115 * auVar12._16_4_;
              auVar25._0_16_ = auVar79;
              auVar25._20_4_ = fVar116 * auVar12._20_4_;
              auVar25._24_4_ = fVar117 * auVar12._24_4_;
              auVar25._28_4_ = auVar12._28_4_;
              auVar43._0_4_ = fVar103 * auVar10._0_4_;
              auVar43._4_4_ = fVar105 * auVar10._4_4_;
              auVar43._8_4_ = fVar106 * auVar10._8_4_;
              auVar43._12_4_ = fVar107 * auVar10._12_4_;
              auVar12._16_4_ = fVar108 * auVar10._16_4_;
              auVar12._0_16_ = auVar43;
              auVar12._20_4_ = fVar109 * auVar10._20_4_;
              auVar12._24_4_ = fVar110 * auVar10._24_4_;
              auVar12._28_4_ = auVar81._28_4_;
              auVar41 = vpminsd_avx(auVar11._16_16_,auVar24._16_16_);
              auVar42 = vpminsd_avx(auVar74,auVar86);
              auVar91._16_16_ = auVar41;
              auVar91._0_16_ = auVar42;
              auVar41 = vpminsd_avx(auVar22._16_16_,auVar25._16_16_);
              auVar42 = vpminsd_avx(auVar67,auVar79);
              auVar99._16_16_ = auVar41;
              auVar99._0_16_ = auVar42;
              auVar65 = auVar23._16_16_;
              in_ZMM14 = ZEXT1664(auVar65);
              auVar41 = vpminsd_avx(auVar65,auVar12._16_16_);
              in_ZMM15 = ZEXT1664(auVar41);
              auVar42 = vpminsd_avx(auVar61,auVar43);
              auVar92._16_16_ = auVar41;
              auVar92._0_16_ = auVar42;
              auVar81 = vmaxps_avx(auVar99,auVar92);
              auVar41 = vpmaxsd_avx(auVar11._16_16_,auVar24._16_16_);
              auVar42 = vpmaxsd_avx(auVar74,auVar86);
              auVar58._16_16_ = auVar41;
              auVar58._0_16_ = auVar42;
              auVar41 = vpmaxsd_avx(auVar22._16_16_,auVar25._16_16_);
              auVar42 = vpmaxsd_avx(auVar67,auVar79);
              auVar71._16_16_ = auVar41;
              auVar71._0_16_ = auVar42;
              auVar72 = ZEXT3264(auVar71);
              auVar41 = vpmaxsd_avx(auVar65,auVar12._16_16_);
              auVar42 = vpmaxsd_avx(auVar61,auVar43);
              auVar46._16_16_ = auVar41;
              auVar46._0_16_ = auVar42;
              auVar10 = vminps_avx(auVar71,auVar46);
              auVar12 = vmaxps_avx(auVar97,auVar91);
              auVar81 = vmaxps_avx(auVar12,auVar81);
              auVar64 = ZEXT3264(auVar81);
              auVar12 = vminps_avx(auVar101,auVar58);
              auVar12 = vminps_avx(auVar12,auVar10);
              auVar81 = vcmpps_avx(auVar81,auVar12,2);
            }
            else {
              pfVar2 = (float *)(uVar30 + 0x100 + uVar37);
              pfVar1 = (float *)(uVar30 + 0x40 + uVar37);
              auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar44._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar44._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar44._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar44._28_4_ = fVar96 + pfVar1[7];
              auVar28._4_4_ = fVar82;
              auVar28._0_4_ = fVar82;
              auVar28._8_4_ = fVar82;
              auVar28._12_4_ = fVar82;
              auVar28._16_4_ = fVar82;
              auVar28._20_4_ = fVar82;
              auVar28._24_4_ = fVar82;
              auVar28._28_4_ = fVar82;
              auVar81 = vsubps_avx(auVar44,auVar28);
              fVar96 = auVar40._0_4_;
              fVar39 = auVar40._4_4_;
              auVar15._4_4_ = fVar39 * auVar81._4_4_;
              auVar15._0_4_ = fVar96 * auVar81._0_4_;
              fVar103 = auVar40._8_4_;
              auVar15._8_4_ = fVar103 * auVar81._8_4_;
              auVar15._12_4_ = auVar40._12_4_ * auVar81._12_4_;
              auVar15._16_4_ = fVar96 * auVar81._16_4_;
              auVar15._20_4_ = fVar39 * auVar81._20_4_;
              auVar15._24_4_ = fVar103 * auVar81._24_4_;
              auVar15._28_4_ = auVar81._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + uVar34);
              pfVar1 = (float *)(uVar30 + 0x40 + uVar34);
              auVar56._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar56._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar56._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar56._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar56._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar56._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar56._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar56._28_4_ = auVar59._28_4_ + pfVar1[7];
              auVar27._4_4_ = fVar6;
              auVar27._0_4_ = fVar6;
              auVar27._8_4_ = fVar6;
              auVar27._12_4_ = fVar6;
              auVar27._16_4_ = fVar6;
              auVar27._20_4_ = fVar6;
              auVar27._24_4_ = fVar6;
              auVar27._28_4_ = fVar6;
              auVar81 = vsubps_avx(auVar56,auVar27);
              fVar48 = auVar66._0_4_;
              fVar105 = auVar66._4_4_;
              auVar16._4_4_ = fVar105 * auVar81._4_4_;
              auVar16._0_4_ = fVar48 * auVar81._0_4_;
              fVar49 = auVar66._8_4_;
              auVar16._8_4_ = fVar49 * auVar81._8_4_;
              auVar16._12_4_ = auVar66._12_4_ * auVar81._12_4_;
              auVar16._16_4_ = fVar48 * auVar81._16_4_;
              auVar16._20_4_ = fVar105 * auVar81._20_4_;
              auVar16._24_4_ = fVar49 * auVar81._24_4_;
              auVar16._28_4_ = auVar81._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + uVar36);
              pfVar1 = (float *)(uVar30 + 0x40 + uVar36);
              auVar62._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar62._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar62._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar62._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar62._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar62._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar62._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar62._28_4_ = auVar64._28_4_ + pfVar1[7];
              auVar26._4_4_ = fVar7;
              auVar26._0_4_ = fVar7;
              auVar26._8_4_ = fVar7;
              auVar26._12_4_ = fVar7;
              auVar26._16_4_ = fVar7;
              auVar26._20_4_ = fVar7;
              auVar26._24_4_ = fVar7;
              auVar26._28_4_ = fVar7;
              auVar81 = vsubps_avx(auVar62,auVar26);
              fVar106 = auVar78._0_4_;
              fVar50 = auVar78._4_4_;
              auVar17._4_4_ = fVar50 * auVar81._4_4_;
              auVar17._0_4_ = fVar106 * auVar81._0_4_;
              fVar107 = auVar78._8_4_;
              auVar17._8_4_ = fVar107 * auVar81._8_4_;
              auVar17._12_4_ = auVar78._12_4_ * auVar81._12_4_;
              auVar17._16_4_ = fVar106 * auVar81._16_4_;
              auVar17._20_4_ = fVar50 * auVar81._20_4_;
              auVar17._24_4_ = fVar107 * auVar81._24_4_;
              auVar17._28_4_ = auVar81._28_4_;
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar37 ^ 0x20));
              auVar81 = vmaxps_avx(auVar16,auVar17);
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar37 ^ 0x20));
              auVar63._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar63._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar63._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar63._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar63._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar63._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar63._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar63._28_4_ = auVar72._28_4_ + pfVar1[7];
              auVar12 = vsubps_avx(auVar63,auVar28);
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar34 ^ 0x20));
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar34 ^ 0x20));
              auVar68._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar68._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar68._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar68._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar68._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar68._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar68._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar68._28_4_ = auVar72._28_4_ + pfVar1[7];
              auVar18._4_4_ = fVar39 * auVar12._4_4_;
              auVar18._0_4_ = fVar96 * auVar12._0_4_;
              auVar18._8_4_ = fVar103 * auVar12._8_4_;
              auVar18._12_4_ = auVar40._12_4_ * auVar12._12_4_;
              auVar18._16_4_ = fVar96 * auVar12._16_4_;
              auVar18._20_4_ = fVar39 * auVar12._20_4_;
              auVar18._24_4_ = fVar103 * auVar12._24_4_;
              auVar18._28_4_ = auVar12._28_4_;
              auVar64 = ZEXT3264(auVar18);
              auVar12 = vsubps_avx(auVar68,auVar27);
              pfVar2 = (float *)(uVar30 + 0x100 + (uVar36 ^ 0x20));
              auVar19._4_4_ = fVar105 * auVar12._4_4_;
              auVar19._0_4_ = fVar48 * auVar12._0_4_;
              auVar19._8_4_ = fVar49 * auVar12._8_4_;
              auVar19._12_4_ = auVar66._12_4_ * auVar12._12_4_;
              auVar19._16_4_ = fVar48 * auVar12._16_4_;
              auVar19._20_4_ = fVar105 * auVar12._20_4_;
              auVar19._24_4_ = fVar49 * auVar12._24_4_;
              auVar19._28_4_ = auVar12._28_4_;
              pfVar1 = (float *)(uVar30 + 0x40 + (uVar36 ^ 0x20));
              auVar75._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar75._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar75._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar75._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar75._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar75._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar75._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar75._28_4_ = fVar82 + pfVar1[7];
              auVar12 = vsubps_avx(auVar75,auVar26);
              auVar20._4_4_ = fVar50 * auVar12._4_4_;
              auVar20._0_4_ = fVar106 * auVar12._0_4_;
              auVar20._8_4_ = fVar107 * auVar12._8_4_;
              auVar20._12_4_ = auVar78._12_4_ * auVar12._12_4_;
              auVar20._16_4_ = fVar106 * auVar12._16_4_;
              auVar20._20_4_ = fVar50 * auVar12._20_4_;
              auVar20._24_4_ = fVar107 * auVar12._24_4_;
              auVar20._28_4_ = auVar12._28_4_;
              auVar10 = vminps_avx(auVar19,auVar20);
              auVar72 = ZEXT3264(auVar10);
              auVar12 = vmaxps_avx(auVar97,auVar15);
              auVar81 = vmaxps_avx(auVar12,auVar81);
              auVar12 = vminps_avx(auVar101,auVar18);
              auVar12 = vminps_avx(auVar12,auVar10);
              auVar81 = vcmpps_avx(auVar81,auVar12,2);
              if (uVar32 == 6) {
                auVar12 = vcmpps_avx(*(undefined1 (*) [32])(uVar30 + 0x1c0),auVar38,2);
                auVar10 = vcmpps_avx(auVar38,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
                auVar64 = ZEXT3264(auVar10);
                auVar12 = vandps_avx(auVar12,auVar10);
                auVar81 = vandps_avx(auVar12,auVar81);
              }
            }
            auVar41 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
            auVar42 = vpsllw_avx(auVar41,0xf);
            auVar47 = ZEXT1664(auVar42);
            auVar41 = vpacksswb_avx(auVar42,auVar42);
            auVar59 = ZEXT1664(auVar41);
            bVar14 = SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar41 >> 0x17,0) & 1) << 2 | (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar41 >> 0x27,0) & 1) << 4 | (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar41 >> 0x37,0) & 1) << 6 | SUB161(auVar41 >> 0x3f,0) << 7;
            if ((((((((auVar42 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar42[0xf]) goto LAB_00e4f630;
            lVar9 = 0;
            if (bVar14 != 0) {
              for (; (bVar14 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar31 = *(ulong *)(uVar30 + lVar9 * 8);
            uVar32 = bVar14 - 1 & (uint)bVar14;
            uVar33 = (ulong)uVar32;
          } while (uVar32 == 0);
          do {
            *puVar35 = uVar31;
            puVar35 = puVar35 + 1;
            lVar9 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar31 = *(ulong *)(uVar30 + lVar9 * 8);
            uVar33 = uVar33 - 1 & uVar33;
          } while (uVar33 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }